

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O3

void test_read_format_rar_unicode_UTF8(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  archive_conflict *a;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  char test_txt [6];
  archive_entry *ae;
  char reffile [33];
  char buff [30];
  undefined4 local_98;
  undefined2 local_94;
  archive_entry *local_90;
  char local_88 [48];
  undefined1 local_58 [40];
  
  builtin_strncpy(local_88 + 0x10,"_rar_unicode.rar",0x11);
  builtin_strncpy(local_88,"test_read_format",0x10);
  local_94 = 0x69;
  local_98 = 0x6a6e616b;
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 != (char *)0x0) {
    extract_reference_file(local_88);
    a = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ö',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'×',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
    iVar1 = archive_read_support_format_all((archive *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ø',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
    wVar2 = archive_read_open_filename(a,local_88,0x2800);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'á',(uint)(wVar2 == L'\0'),
                     "0 == archive_read_open_filename(a, reffile, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ä',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'ô',anon_var_dwarf_91362,"f1name",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
               L'\x01');
    tVar5 = archive_entry_mtime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'õ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
    lVar6 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ö',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'÷',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ú',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'Ć',anon_var_dwarf_9138e,"f2name",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
               L'\x01');
    tVar5 = archive_entry_mtime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ć',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
    lVar6 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ĉ',5,"5",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ĉ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    lVar7 = archive_read_data((archive *)a,local_58,5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ċ',5,"5",lVar7,"archive_read_data(a, buff, 5)",a);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ċ',local_58,"buff",&local_98,"test_txt",5,"5",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Č',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'č',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    iVar1 = archive_read_next_header((archive *)a,&local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Đ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'Ě',anon_var_dwarf_913c7,"f3name",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
               L'\x01');
    tVar5 = archive_entry_mtime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ě',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
    lVar6 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ĝ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ĝ',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ġ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'Ħ',anon_var_dwarf_913e9,"f4name",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
               L'\x01');
    tVar5 = archive_entry_mtime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ħ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
    lVar6 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ĩ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ĩ',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ĭ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'Ĵ',anon_var_dwarf_913ff,"f5name",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
               L'\x01');
    pcVar4 = archive_entry_symlink(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'ĸ',anon_var_dwarf_9138e + 10,
               "\"\\xE6\\xBC\\xA2\\xE5\\xAD\\x97\\xE9\\x95\\xB7\\xE3\\x81\\x84\\xE3\\x83\\x95\" \"\\xE3\\x82\\xA1\\xE3\\x82\\xA4\\xE3\\x83\\xAB\\xE5\\x90\\x8Dlong-filename-in-\" \"\\xE6\\xBC\\xA2\\xE5\\xAD\\x97.txt\""
               ,pcVar4,"archive_entry_symlink(ae)",(void *)0x0,L'\x01');
    tVar5 = archive_entry_mtime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ĺ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
    lVar6 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ĺ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ļ',0xa1ed,"41453",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ļ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ľ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    lVar7 = archive_read_data((archive *)a,local_58,0x1e);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ľ',0,"0",lVar7,"archive_read_data(a, buff, sizeof(buff))",a);
    iVar1 = archive_read_next_header((archive *)a,&local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ł',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
    pcVar4 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
               ,L'ń',anon_var_dwarf_9144e,
               "\"abcdefghijklmnopqrs\\xE3\\x83\\x86\\xE3\\x82\\xB9\\xE3\\x83\\x88.txt\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\x01');
    tVar5 = archive_entry_mtime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'Ņ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
    lVar6 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ņ',0x10,"16",lVar6,"archive_entry_size(ae)",(void *)0x0);
    mVar3 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ň',0x81b4,"33204",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ň',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ŉ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    lVar7 = archive_read_data((archive *)a,local_58,0x1e);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ŋ',0x10,"16",lVar7,"archive_read_data(a, buff, sizeof(buff))",a);
    iVar1 = archive_read_next_header((archive *)a,&local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                     ,L'ō',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a);
    iVar1 = archive_file_count((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ŏ',6,"6",(long)iVar1,"archive_file_count(a)",(void *)0x0);
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'ŏ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
    iVar1 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                        ,L'Ő',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                 ,L'Ñ');
  test_skipping("en_US.UTF-8 locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_unicode_UTF8)
{
  char buff[30];
  const char reffile[] = "test_read_format_rar_unicode.rar";
  const char test_txt[] = "kanji";
  struct archive_entry *ae;
  struct archive *a;

  if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
	skipping("en_US.UTF-8 locale not available on this system.");
	return;
  }

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
#if defined(_WIN32) && !defined(__CYGWIN__)
  /* Windows will use OEMCP as default, but the file is UTF-8. */
  if (ARCHIVE_OK != archive_read_set_options(a, "rar:hdrcharset=UTF-8")) {
	skipping("This system cannot read input as UTF-8.");
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	return;
  }
#endif
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
#if defined(__APPLE__)
#define f1name "\xE8\xA1\xA8\xE3\x81\x9F\xE3\x82\x99\xE3\x82\x88/"\
      "\xE6\x96\xB0\xE3\x81\x97\xE3\x81\x84\xE3\x83\x95\xE3\x82\xA9"\
      "\xE3\x83\xAB\xE3\x82\xBF\xE3\x82\x99/\xE6\x96\xB0\xE8\xA6\x8F"\
      "\xE3\x83\x86\xE3\x82\xAD\xE3\x82\xB9\xE3\x83\x88 "\
      "\xE3\x83\x88\xE3\x82\x99\xE3\x82\xAD\xE3\x83\xA5\xE3\x83\xA1"\
      "\xE3\x83\xB3\xE3\x83\x88.txt" /* NFD */
#else
#define f1name "\xE8\xA1\xA8\xE3\x81\xA0\xE3\x82\x88/"\
      "\xE6\x96\xB0\xE3\x81\x97\xE3\x81\x84\xE3\x83\x95\xE3\x82\xA9"\
      "\xE3\x83\xAB\xE3\x83\x80/\xE6\x96\xB0\xE8\xA6\x8F"\
      "\xE3\x83\x86\xE3\x82\xAD\xE3\x82\xB9\xE3\x83\x88 "\
      "\xE3\x83\x89\xE3\x82\xAD\xE3\x83\xA5\xE3\x83\xA1"\
      "\xE3\x83\xB3\xE3\x83\x88.txt" /* NFC */
#endif
  assertEqualUTF8String(f1name, archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
#if defined(__APPLE__)
#define f2name "\xE8\xA1\xA8\xE3\x81\x9F\xE3\x82\x99\xE3\x82\x88/"\
      "\xE6\xBC\xA2\xE5\xAD\x97\xE9\x95\xB7\xE3\x81\x84\xE3\x83\x95"\
      "\xE3\x82\xA1\xE3\x82\xA4\xE3\x83\xAB\xE5\x90\x8Dlong-filename-in-"\
      "\xE6\xBC\xA2\xE5\xAD\x97.txt" /* NFD */
#else
#define f2name "\xE8\xA1\xA8\xE3\x81\xA0\xE3\x82\x88/"\
      "\xE6\xBC\xA2\xE5\xAD\x97\xE9\x95\xB7\xE3\x81\x84\xE3\x83\x95"\
      "\xE3\x82\xA1\xE3\x82\xA4\xE3\x83\xAB\xE5\x90\x8Dlong-filename-in-"\
      "\xE6\xBC\xA2\xE5\xAD\x97.txt" /* NFC */
#endif
  assertEqualUTF8String(f2name, archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(5, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualIntA(a, 5, archive_read_data(a, buff, 5));
  assertEqualMem(buff, test_txt, 5);
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
#if defined(__APPLE__)
#define f3name "\xE8\xA1\xA8\xE3\x81\x9F\xE3\x82\x99\xE3\x82\x88/"\
      "\xE6\x96\xB0\xE3\x81\x97\xE3\x81\x84\xE3\x83\x95\xE3\x82"\
      "\xA9\xE3\x83\xAB\xE3\x82\xBF\xE3\x82\x99" /* NFD */
#else
#define f3name "\xE8\xA1\xA8\xE3\x81\xA0\xE3\x82\x88/"\
      "\xE6\x96\xB0\xE3\x81\x97\xE3\x81\x84\xE3\x83\x95\xE3\x82"\
      "\xA9\xE3\x83\xAB\xE3\x83\x80" /* NFC */
#endif
  assertEqualUTF8String(f3name, archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
#if defined(__APPLE__)
#define f4name "\xE8\xA1\xA8\xE3\x81\x9F\xE3\x82\x99\xE3\x82\x88" /* NFD */
#else
#define f4name "\xE8\xA1\xA8\xE3\x81\xA0\xE3\x82\x88" /* NFC */
#endif
  assertEqualUTF8String(f4name, archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));

  /* Fifth header, which has a symbolic-link name in multi-byte characters. */
  assertA(0 == archive_read_next_header(a, &ae));
#if defined(__APPLE__)
#define f5name "\xE8\xA1\xA8\xE3\x81\x9F\xE3\x82\x99\xE3\x82\x88/"\
      "\xE3\x83\x95\xE3\x82\xA1\xE3\x82\xA4\xE3\x83\xAB" /* NFD */
#else
#define f5name "\xE8\xA1\xA8\xE3\x81\xA0\xE3\x82\x88/"\
      "\xE3\x83\x95\xE3\x82\xA1\xE3\x82\xA4\xE3\x83\xAB" /* NFC */
#endif
  assertEqualUTF8String(f5name, archive_entry_pathname(ae));
  assertEqualUTF8String(
      "\xE6\xBC\xA2\xE5\xAD\x97\xE9\x95\xB7\xE3\x81\x84\xE3\x83\x95"
      "\xE3\x82\xA1\xE3\x82\xA4\xE3\x83\xAB\xE5\x90\x8Dlong-filename-in-"
      "\xE6\xBC\xA2\xE5\xAD\x97.txt", archive_entry_symlink(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(41453, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertEqualIntA(a, 0, archive_read_data(a, buff, sizeof(buff)));

  /* Sixth header */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualUTF8String(
    "abcdefghijklmnopqrs\xE3\x83\x86\xE3\x82\xB9\xE3\x83\x88.txt",
    archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertEqualInt(16, archive_entry_size(ae));
  assertEqualInt(33204, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertEqualIntA(a, 16, archive_read_data(a, buff, sizeof(buff)));

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(6, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}